

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

void fmt::v6::internal::fallback_format<double>(double d,buffer<char> *buf,int *exp10)

{
  uint *puVar1;
  uint *puVar2;
  uint *puVar3;
  uint *puVar4;
  char *pcVar5;
  size_t sVar6;
  char cVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  bigint *lhs2;
  uint64_t value;
  uint uVar13;
  int exp;
  long lVar14;
  int iVar15;
  bool bVar16;
  bigint numerator;
  bigint lower;
  bigint upper_store;
  bigint denominator;
  bigint *local_318;
  ulong local_308;
  bigint local_2d0;
  bigint local_228;
  bigint local_180;
  bigint local_d8;
  
  local_2d0.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_2d0.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_001b6cc8;
  puVar1 = local_2d0.bigits_.store_;
  local_2d0.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_2d0.exp_ = 0;
  local_d8.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_d8.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_001b6cc8;
  puVar2 = local_d8.bigits_.store_;
  local_d8.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_d8.exp_ = 0;
  local_228.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_228.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_001b6cc8;
  puVar3 = local_228.bigits_.store_;
  local_228.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_228.exp_ = 0;
  local_318 = &local_180;
  local_180.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_180.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_001b6cc8;
  puVar4 = local_180.bigits_.store_;
  local_180.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_180.exp_ = 0;
  uVar12 = (ulong)d & 0xfffffffffffff;
  uVar13 = (uint)((ulong)d >> 0x34) & 0x7ff;
  local_2d0.bigits_.super_buffer<unsigned_int>.ptr_ = puVar1;
  local_228.bigits_.super_buffer<unsigned_int>.ptr_ = puVar3;
  local_180.bigits_.super_buffer<unsigned_int>.ptr_ = puVar4;
  local_d8.bigits_.super_buffer<unsigned_int>.ptr_ = puVar2;
  if (uVar13 == 0) {
    value = uVar12 * 2;
    iVar9 = -0x432;
    iVar15 = 1;
    bVar16 = false;
    local_308 = uVar12;
LAB_00170316:
    exp = *exp10;
    if (exp < 0) {
      bigint::assign_pow10(&local_2d0,-exp);
      sVar6 = local_2d0.bigits_.super_buffer<unsigned_int>.size_;
      if (local_228.bigits_.super_buffer<unsigned_int>.capacity_ <
          local_2d0.bigits_.super_buffer<unsigned_int>.size_) {
        (**local_228.bigits_.super_buffer<unsigned_int>._vptr_buffer)
                  (&local_228,local_2d0.bigits_.super_buffer<unsigned_int>.size_);
      }
      local_228.bigits_.super_buffer<unsigned_int>.size_ = sVar6;
      if (local_2d0.bigits_.super_buffer<unsigned_int>.size_ != 0) {
        memmove(local_228.bigits_.super_buffer<unsigned_int>.ptr_,
                local_2d0.bigits_.super_buffer<unsigned_int>.ptr_,
                local_2d0.bigits_.super_buffer<unsigned_int>.size_ << 2);
      }
      sVar6 = local_2d0.bigits_.super_buffer<unsigned_int>.size_;
      local_228.exp_ = local_2d0.exp_;
      if (bVar16) {
        if (local_180.bigits_.super_buffer<unsigned_int>.capacity_ <
            local_2d0.bigits_.super_buffer<unsigned_int>.size_) {
          (**local_180.bigits_.super_buffer<unsigned_int>._vptr_buffer)
                    (&local_180,local_2d0.bigits_.super_buffer<unsigned_int>.size_);
        }
        local_180.bigits_.super_buffer<unsigned_int>.size_ = sVar6;
        if (local_2d0.bigits_.super_buffer<unsigned_int>.size_ != 0) {
          memmove(local_180.bigits_.super_buffer<unsigned_int>.ptr_,
                  local_2d0.bigits_.super_buffer<unsigned_int>.ptr_,
                  local_2d0.bigits_.super_buffer<unsigned_int>.size_ << 2);
        }
        local_318 = &local_180;
        local_180.exp_ = local_2d0.exp_;
        bigint::operator<<=(local_318,1);
      }
      else {
        local_318 = (bigint *)0x0;
      }
      bigint::multiply(&local_2d0,value);
      *local_d8.bigits_.super_buffer<unsigned_int>.ptr_ = 1;
      if (local_d8.bigits_.super_buffer<unsigned_int>.capacity_ == 0) {
        (**local_d8.bigits_.super_buffer<unsigned_int>._vptr_buffer)(&local_d8,1);
      }
      local_d8.bigits_.super_buffer<unsigned_int>.size_ = 1;
      local_d8.exp_ = 0;
      bigint::operator<<=(&local_d8,iVar15 - iVar9);
    }
    else {
      uVar12 = 0xffffffffffffffff;
      do {
        uVar11 = uVar12;
        local_2d0.bigits_.store_[uVar11 + 1] = (uint)value;
        value = value >> 0x20;
        uVar12 = uVar11 + 1;
      } while (value != 0);
      if (0x1f < uVar11 + 1) {
        basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_>::grow
                  (&local_2d0.bigits_,uVar11 + 2);
        exp = *exp10;
      }
      local_2d0.exp_ = 0;
      local_2d0.bigits_.super_buffer<unsigned_int>.size_ = uVar11 + 2;
      bigint::assign_pow10(&local_d8,exp);
      bigint::operator<<=(&local_d8,iVar15 - iVar9);
      *local_228.bigits_.super_buffer<unsigned_int>.ptr_ = 1;
      if (local_228.bigits_.super_buffer<unsigned_int>.capacity_ == 0) {
        (**local_228.bigits_.super_buffer<unsigned_int>._vptr_buffer)(&local_228,1);
      }
      local_228.bigits_.super_buffer<unsigned_int>.size_ = 1;
      local_228.exp_ = 0;
      if (bVar16) {
        *local_180.bigits_.super_buffer<unsigned_int>.ptr_ = 2;
        if (local_180.bigits_.super_buffer<unsigned_int>.capacity_ == 0) {
          (**local_180.bigits_.super_buffer<unsigned_int>._vptr_buffer)(&local_180,1);
        }
        local_318 = &local_180;
        local_180.bigits_.super_buffer<unsigned_int>.size_ = 1;
        local_180.exp_ = 0;
      }
      else {
        local_318 = (bigint *)0x0;
      }
    }
  }
  else {
    local_308 = uVar12 + 0x10000000000000;
    iVar9 = uVar13 - 0x433;
    bVar16 = uVar13 != 1 && uVar12 == 0;
    iVar15 = bVar16 + 1;
    value = local_308 << (sbyte)iVar15;
    if (uVar13 < 0x433) goto LAB_00170316;
    uVar11 = 0xffffffffffffffff;
    do {
      uVar10 = uVar11;
      local_2d0.bigits_.store_[uVar10 + 1] = (uint)value;
      value = value >> 0x20;
      uVar11 = uVar10 + 1;
    } while (value != 0);
    if (0x1f < uVar10 + 1) {
      basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_>::grow
                (&local_2d0.bigits_,uVar10 + 2);
    }
    local_2d0.exp_ = 0;
    local_2d0.bigits_.super_buffer<unsigned_int>.size_ = uVar10 + 2;
    bigint::operator<<=(&local_2d0,iVar9);
    *local_228.bigits_.super_buffer<unsigned_int>.ptr_ = 1;
    if (local_228.bigits_.super_buffer<unsigned_int>.capacity_ == 0) {
      (**local_228.bigits_.super_buffer<unsigned_int>._vptr_buffer)(&local_228,1);
    }
    local_228.bigits_.super_buffer<unsigned_int>.size_ = 1;
    local_228.exp_ = 0;
    bigint::operator<<=(&local_228,iVar9);
    if (uVar13 != 1 && uVar12 == 0) {
      *local_180.bigits_.super_buffer<unsigned_int>.ptr_ = 1;
      if (local_180.bigits_.super_buffer<unsigned_int>.capacity_ == 0) {
        (**local_180.bigits_.super_buffer<unsigned_int>._vptr_buffer)(&local_180,1);
      }
      local_180.bigits_.super_buffer<unsigned_int>.size_ = 1;
      local_180.exp_ = 0;
      bigint::operator<<=(&local_180,uVar13 - 0x432);
    }
    else {
      local_318 = (bigint *)0x0;
    }
    bigint::assign_pow10(&local_d8,*exp10);
    bigint::operator<<=(&local_d8,1);
  }
  lhs2 = local_318;
  if (local_318 == (bigint *)0x0) {
    lhs2 = &local_228;
  }
  pcVar5 = buf->ptr_;
  uVar13 = ~(uint)local_308 & 1;
  lVar14 = 0;
  while( true ) {
    uVar8 = bigint::divmod_assign(&local_2d0,&local_d8);
    iVar9 = compare(&local_2d0,&local_228);
    iVar15 = add_compare(&local_2d0,lhs2,&local_d8);
    pcVar5[lVar14] = (char)uVar8 + '0';
    if ((iVar9 < (int)uVar13) || ((int)-uVar13 < iVar15)) break;
    bigint::multiply(&local_2d0,10);
    bigint::multiply(&local_228,10);
    if (local_318 != (bigint *)0x0) {
      bigint::multiply(local_318,10);
    }
    lVar14 = lVar14 + 1;
  }
  if (iVar9 < (int)uVar13) {
    if (iVar15 <= (int)-uVar13) goto LAB_001706dd;
    iVar9 = add_compare(&local_2d0,&local_2d0,&local_d8);
    if ((iVar9 < 1) && ((uVar8 & 1) == 0 || iVar9 != 0)) goto LAB_001706dd;
    cVar7 = pcVar5[lVar14] + '\x01';
  }
  else {
    cVar7 = (char)uVar8 + '1';
  }
  pcVar5[lVar14] = cVar7;
LAB_001706dd:
  uVar12 = lVar14 + 1U & 0xffffffff;
  if (buf->capacity_ < uVar12) {
    (**buf->_vptr_buffer)(buf,uVar12);
  }
  buf->size_ = uVar12;
  *exp10 = *exp10 - (int)lVar14;
  local_180.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_001b6cc8;
  if (local_180.bigits_.super_buffer<unsigned_int>.ptr_ != puVar4) {
    operator_delete(local_180.bigits_.super_buffer<unsigned_int>.ptr_,
                    local_180.bigits_.super_buffer<unsigned_int>.capacity_ << 2);
  }
  local_228.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_001b6cc8;
  if (local_228.bigits_.super_buffer<unsigned_int>.ptr_ != puVar3) {
    operator_delete(local_228.bigits_.super_buffer<unsigned_int>.ptr_,
                    local_228.bigits_.super_buffer<unsigned_int>.capacity_ << 2);
  }
  local_d8.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_001b6cc8;
  if (local_d8.bigits_.super_buffer<unsigned_int>.ptr_ != puVar2) {
    operator_delete(local_d8.bigits_.super_buffer<unsigned_int>.ptr_,
                    local_d8.bigits_.super_buffer<unsigned_int>.capacity_ << 2);
  }
  local_2d0.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_001b6cc8;
  if (local_2d0.bigits_.super_buffer<unsigned_int>.ptr_ != puVar1) {
    operator_delete(local_2d0.bigits_.super_buffer<unsigned_int>.ptr_,
                    local_2d0.bigits_.super_buffer<unsigned_int>.capacity_ << 2);
  }
  return;
}

Assistant:

void fallback_format(Double d, buffer<char>& buf, int& exp10) {
  bigint numerator;    // 2 * R in (FPP)^2.
  bigint denominator;  // 2 * S in (FPP)^2.
  // lower and upper are differences between value and corresponding boundaries.
  bigint lower;             // (M^- in (FPP)^2).
  bigint upper_store;       // upper's value if different from lower.
  bigint* upper = nullptr;  // (M^+ in (FPP)^2).
  fp value;
  // Shift numerator and denominator by an extra bit or two (if lower boundary
  // is closer) to make lower and upper integers. This eliminates multiplication
  // by 2 during later computations.
  // TODO: handle float
  int shift = value.assign(d) ? 2 : 1;
  uint64_t significand = value.f << shift;
  if (value.e >= 0) {
    numerator.assign(significand);
    numerator <<= value.e;
    lower.assign(1);
    lower <<= value.e;
    if (shift != 1) {
      upper_store.assign(1);
      upper_store <<= value.e + 1;
      upper = &upper_store;
    }
    denominator.assign_pow10(exp10);
    denominator <<= 1;
  } else if (exp10 < 0) {
    numerator.assign_pow10(-exp10);
    lower.assign(numerator);
    if (shift != 1) {
      upper_store.assign(numerator);
      upper_store <<= 1;
      upper = &upper_store;
    }
    numerator *= significand;
    denominator.assign(1);
    denominator <<= shift - value.e;
  } else {
    numerator.assign(significand);
    denominator.assign_pow10(exp10);
    denominator <<= shift - value.e;
    lower.assign(1);
    if (shift != 1) {
      upper_store.assign(1ULL << 1);
      upper = &upper_store;
    }
  }
  if (!upper) upper = &lower;
  // Invariant: value == (numerator / denominator) * pow(10, exp10).
  bool even = (value.f & 1) == 0;
  int num_digits = 0;
  char* data = buf.data();
  for (;;) {
    int digit = numerator.divmod_assign(denominator);
    bool low = compare(numerator, lower) - even < 0;  // numerator <[=] lower.
    // numerator + upper >[=] pow10:
    bool high = add_compare(numerator, *upper, denominator) + even > 0;
    data[num_digits++] = static_cast<char>('0' + digit);
    if (low || high) {
      if (!low) {
        ++data[num_digits - 1];
      } else if (high) {
        int result = add_compare(numerator, numerator, denominator);
        // Round half to even.
        if (result > 0 || (result == 0 && (digit % 2) != 0))
          ++data[num_digits - 1];
      }
      buf.resize(to_unsigned(num_digits));
      exp10 -= num_digits - 1;
      return;
    }
    numerator *= 10;
    lower *= 10;
    if (upper != &lower) *upper *= 10;
  }
}